

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.c
# Opt level: O1

CURLcode Curl_md4it(uchar *output,uchar *input,size_t len)

{
  uchar *data;
  undefined8 uVar1;
  uchar uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  size_t __n;
  ulong uVar6;
  MD4_CTX ctx;
  MD4_CTX local_c8;
  
  local_c8.a = 0x67452301;
  local_c8.b = 0xefcdab89;
  local_c8.c = 0x98badcfe;
  local_c8.d = 0x10325476;
  local_c8.lo = 0;
  local_c8.hi = 0;
  uVar3 = curlx_uztoui(len);
  uVar1 = local_c8._0_8_;
  uVar6 = (ulong)uVar3;
  if ((uVar3 + local_c8.lo & 0x1fffffff) < local_c8.lo) {
    local_c8.hi = local_c8.hi + 1;
  }
  local_c8._0_8_ = CONCAT44(local_c8.hi + (uVar3 >> 0x1d),uVar3 + local_c8.lo) & 0xffffffff1fffffff;
  uVar4 = uVar1 & 0x3f;
  if ((uVar1 & 0x3f) != 0) {
    __n = 0x40 - uVar4;
    if (uVar3 < (uint)__n) {
      memcpy(local_c8.buffer + uVar4,input,uVar6);
      goto LAB_0013e8c9;
    }
    memcpy(local_c8.buffer + uVar4,input,__n);
    input = input + __n;
    uVar6 = uVar6 - __n;
    my_md4_body(&local_c8,local_c8.buffer,0x40);
  }
  if (0x3f < uVar6) {
    input = (uchar *)my_md4_body(&local_c8,input,uVar6 & 0xffffffffffffffc0);
    uVar6 = (ulong)((uint)uVar6 & 0x3f);
  }
  memcpy(local_c8.buffer,input,uVar6);
LAB_0013e8c9:
  data = local_c8.buffer;
  uVar6 = (ulong)(local_c8.lo & 0x3f);
  lVar5 = uVar6 + 1;
  local_c8.buffer[uVar6] = 0x80;
  uVar6 = uVar6 ^ 0x3f;
  if (uVar6 < 8) {
    memset(data + lVar5,0,uVar6);
    uVar6 = 0x40;
    my_md4_body(&local_c8,data,0x40);
    lVar5 = 0;
  }
  memset(data + lVar5,0,uVar6 - 8);
  uVar3 = local_c8.lo << 3;
  local_c8.lo = uVar3;
  local_c8.buffer[0x38] = curlx_ultouc((ulong)(uVar3 & 0xff));
  local_c8.buffer[0x39] = curlx_ultouc((ulong)local_c8._0_8_ >> 8 & 0xff);
  local_c8.buffer[0x3a] = curlx_ultouc((ulong)local_c8._0_8_ >> 0x10 & 0xff);
  local_c8.buffer[0x3b] = curlx_ultouc((ulong)local_c8._0_8_ >> 0x18 & 0xff);
  local_c8.buffer[0x3c] = curlx_ultouc((ulong)local_c8._0_8_ >> 0x20 & 0xff);
  local_c8.buffer[0x3d] = curlx_ultouc((ulong)local_c8._0_8_ >> 0x28 & 0xff);
  local_c8.buffer[0x3e] = curlx_ultouc((ulong)local_c8._0_8_ >> 0x30 & 0xff);
  local_c8.buffer[0x3f] = curlx_ultouc((ulong)local_c8._0_8_ >> 0x38);
  my_md4_body(&local_c8,data,0x40);
  uVar2 = curlx_ultouc(local_c8._8_8_ & 0xff);
  *output = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._8_8_ >> 8 & 0xff);
  output[1] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._8_8_ >> 0x10 & 0xff);
  output[2] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._8_8_ >> 0x18 & 0xff);
  output[3] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._8_8_ >> 0x20 & 0xff);
  output[4] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._8_8_ >> 0x28 & 0xff);
  output[5] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._8_8_ >> 0x30 & 0xff);
  output[6] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._8_8_ >> 0x38);
  output[7] = uVar2;
  uVar2 = curlx_ultouc(local_c8._16_8_ & 0xff);
  output[8] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._16_8_ >> 8 & 0xff);
  output[9] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._16_8_ >> 0x10 & 0xff);
  output[10] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._16_8_ >> 0x18 & 0xff);
  output[0xb] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._16_8_ >> 0x20 & 0xff);
  output[0xc] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._16_8_ >> 0x28 & 0xff);
  output[0xd] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._16_8_ >> 0x30 & 0xff);
  output[0xe] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c8._16_8_ >> 0x38);
  output[0xf] = uVar2;
  memset(&local_c8,0,0x98);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_md4it(unsigned char *output, const unsigned char *input,
                    const size_t len)
{
  MD4_CTX ctx;

#ifdef VOID_MD4_INIT
  MD4_Init(&ctx);
#else
  if(!MD4_Init(&ctx))
    return CURLE_FAILED_INIT;
#endif

  MD4_Update(&ctx, input, curlx_uztoui(len));
  MD4_Final(output, &ctx);
  return CURLE_OK;
}